

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::ReadListFile(cmFindPackageCommand *this,string *f,PolicyScopeRule psr)

{
  bool bVar1;
  bool local_d1;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  undefined1 local_70 [8];
  string e;
  undefined1 local_40 [8];
  SetGlobalTargetImportScope globScope;
  ITScope scope;
  bool noPolicyScope;
  PolicyScopeRule psr_local;
  string *f_local;
  cmFindPackageCommand *this_local;
  
  local_d1 = (this->PolicyScope & 1U) == 0 || psr == NoPolicyScope;
  globScope._12_4_ = this->GlobalScope & Global;
  cmMakefile::SetGlobalTargetImportScope::SetGlobalTargetImportScope
            ((SetGlobalTargetImportScope *)local_40,(this->super_cmFindCommon).Makefile,
             globScope._12_4_);
  bVar1 = cmMakefile::ReadDependentFile((this->super_cmFindCommon).Makefile,f,local_d1);
  if (bVar1) {
    e.field_2._8_4_ = 1;
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_a0,"Error reading CMake code from \"");
    cmAlphaNum::cmAlphaNum(&local_d0,f);
    cmStrCat<char[3]>((string *)local_70,&local_a0,&local_d0,(char (*) [3])0xd2b755);
    cmFindCommon::SetError(&this->super_cmFindCommon,(string *)local_70);
    e.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_70);
  }
  cmMakefile::SetGlobalTargetImportScope::~SetGlobalTargetImportScope
            ((SetGlobalTargetImportScope *)local_40);
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::ReadListFile(const std::string& f,
                                        const PolicyScopeRule psr)
{
  const bool noPolicyScope = !this->PolicyScope || psr == NoPolicyScope;

  using ITScope = cmMakefile::ImportedTargetScope;
  ITScope scope = this->GlobalScope ? ITScope::Global : ITScope::Local;
  cmMakefile::SetGlobalTargetImportScope globScope(this->Makefile, scope);

  if (this->Makefile->ReadDependentFile(f, noPolicyScope)) {
    return true;
  }
  std::string const e = cmStrCat("Error reading CMake code from \"", f, "\".");
  this->SetError(e);
  return false;
}